

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int gcm_mask(mbedtls_gcm_context *ctx,uchar *ectr,size_t offset,size_t use_len,uchar *input,
            uchar *output)

{
  size_t in_RCX;
  uchar *in_RDX;
  mbedtls_cipher_context_t *in_RSI;
  long in_RDI;
  uchar *in_R8;
  size_t *in_R9;
  size_t olen;
  int ret;
  uint64_t x_2;
  size_t i_2;
  uint64_t x_1;
  size_t i_1;
  uint64_t x;
  size_t i;
  uint64_t r_1;
  uint64_t r;
  uint64_t r_3;
  uint64_t r_2;
  uint64_t r_5;
  uint64_t r_4;
  size_t len;
  undefined4 in_stack_fffffffffffffea0;
  int local_124;
  ulong local_118;
  ulong local_d8;
  ulong local_98;
  
  len = 0;
  local_124 = mbedtls_cipher_update(in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  if (local_124 == 0) {
    if (*(char *)(in_RDI + 0x188) == '\0') {
      for (local_98 = 0; local_98 + 8 <= in_RCX; local_98 = local_98 + 8) {
        *(ulong *)(in_RDX + local_98 + in_RDI + 0x178) =
             *(ulong *)(in_RDX + local_98 + in_RDI + 0x178) ^ *(ulong *)(in_R8 + local_98);
      }
      for (; local_98 < in_RCX; local_98 = local_98 + 1) {
        in_RDX[local_98 + in_RDI + 0x178] = in_RDX[local_98 + in_RDI + 0x178] ^ in_R8[local_98];
      }
    }
    for (local_d8 = 0; local_d8 + 8 <= in_RCX; local_d8 = local_d8 + 8) {
      *(ulong *)((long)in_R9 + local_d8) =
           *(ulong *)(in_RDX + (long)(in_RSI->unprocessed_data + (local_d8 - 0x10))) ^
           *(ulong *)(in_R8 + local_d8);
    }
    for (; local_d8 < in_RCX; local_d8 = local_d8 + 1) {
      *(uchar *)((long)in_R9 + local_d8) =
           in_RDX[(long)(in_RSI->unprocessed_data + (local_d8 - 0x10))] ^ in_R8[local_d8];
    }
    if (*(char *)(in_RDI + 0x188) == '\x01') {
      for (local_118 = 0; local_118 + 8 <= in_RCX; local_118 = local_118 + 8) {
        *(ulong *)(in_RDX + local_118 + in_RDI + 0x178) =
             *(ulong *)(in_RDX + local_118 + in_RDI + 0x178) ^ *(ulong *)((long)in_R9 + local_118);
      }
      for (; local_118 < in_RCX; local_118 = local_118 + 1) {
        in_RDX[local_118 + in_RDI + 0x178] =
             in_RDX[local_118 + in_RDI + 0x178] ^ *(byte *)((long)in_R9 + local_118);
      }
    }
    local_124 = 0;
  }
  else {
    mbedtls_platform_zeroize((void *)CONCAT44(local_124,in_stack_fffffffffffffea0),len);
  }
  return local_124;
}

Assistant:

static int gcm_mask(mbedtls_gcm_context *ctx,
                    unsigned char ectr[16],
                    size_t offset, size_t use_len,
                    const unsigned char *input,
                    unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

#if defined(MBEDTLS_BLOCK_CIPHER_C)
    ret = mbedtls_block_cipher_encrypt(&ctx->block_cipher_ctx, ctx->y, ectr);
#else
    size_t olen = 0;
    ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->y, 16, ectr, &olen);
#endif
    if (ret != 0) {
        mbedtls_platform_zeroize(ectr, 16);
        return ret;
    }

    if (ctx->mode == MBEDTLS_GCM_DECRYPT) {
        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, input, use_len);
    }
    mbedtls_xor(output, ectr + offset, input, use_len);
    if (ctx->mode == MBEDTLS_GCM_ENCRYPT) {
        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, output, use_len);
    }

    return 0;
}